

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

l_mem propagatemark(global_State *g)

{
  lu_byte *plVar1;
  byte *pbVar2;
  byte bVar3;
  uint uVar4;
  GCObject *L;
  TString *pTVar5;
  long lVar6;
  global_State *pgVar7;
  TValue *pTVar8;
  char *pcVar9;
  char *pcVar10;
  Table *pTVar11;
  ulong uVar12;
  CallInfo *pCVar13;
  lua_State *th;
  GCObject *pGVar14;
  TValue **__s;
  Table *pTVar15;
  long lVar16;
  Table *pTVar17;
  GCObject **ppGVar18;
  long lVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  
  L = g->gray;
  (L->gch).marked = (L->gch).marked | 4;
  uVar12 = 0;
  switch((L->gch).tt) {
  case '\x05':
    g->gray = (L->h).gclist;
    pGVar14 = (GCObject *)(L->h).metatable;
    if (pGVar14 == (GCObject *)0x0) {
LAB_00107f36:
      bVar22 = false;
LAB_00107f3e:
      lVar16 = (long)(L->h).sizearray;
      lVar19 = lVar16 * 0x10 + -8;
      while (bVar20 = lVar16 != 0, lVar16 = lVar16 + -1, bVar20) {
        if ((3 < *(int *)((long)&((L->h).array)->value + lVar19)) &&
           (pGVar14 = *(GCObject **)((long)(L->h).array + lVar19 + -8),
           ((pGVar14->gch).marked & 3) != 0)) {
          reallymarkobject(g,pGVar14);
        }
        lVar19 = lVar19 + -0x10;
      }
      bVar20 = false;
LAB_00107f7a:
      lVar19 = (0x100000000 << ((L->h).lsizenode & 0x3f)) >> 0x20;
      lVar16 = lVar19 * 0x28 + -0x10;
      while (bVar21 = lVar19 != 0, lVar19 = lVar19 + -1, bVar21) {
        pgVar7 = (global_State *)(L->h).node;
        if (*(int *)((long)pgVar7 + lVar16 + -0x10) == 0) {
          if (3 < *(int *)((long)&(pgVar7->strt).hash + lVar16)) {
            *(undefined4 *)((long)&(pgVar7->strt).hash + lVar16) = 0xb;
          }
        }
        else {
          if (((!bVar22) && (3 < *(int *)((long)&(pgVar7->strt).hash + lVar16))) &&
             (pGVar14 = *(GCObject **)((long)pgVar7 + lVar16 + -8), ((pGVar14->gch).marked & 3) != 0
             )) {
            reallymarkobject(g,pGVar14);
          }
          if (((!bVar20) && (3 < *(int *)((long)pgVar7 + lVar16 + -0x10))) &&
             (pGVar14 = *(GCObject **)((long)pgVar7 + lVar16 + -0x18),
             ((pGVar14->gch).marked & 3) != 0)) {
            reallymarkobject(g,pGVar14);
          }
        }
        lVar16 = lVar16 + -0x28;
      }
      if ((bool)(bVar22 | bVar20)) goto LAB_0010800e;
    }
    else {
      if (((pGVar14->gch).marked & 3) != 0) {
        reallymarkobject(g,pGVar14);
        pGVar14 = (GCObject *)(L->h).metatable;
        if (pGVar14 == (GCObject *)0x0) goto LAB_00107f36;
      }
      if (((((pGVar14->h).flags & 8) != 0) ||
          (pTVar8 = luaT_gettm(&pGVar14->h,TM_MODE,g->tmname[3]), pTVar8 == (TValue *)0x0)) ||
         (pTVar8->tt != 4)) goto LAB_00107f36;
      __s = &(((pTVar8->value).gc)->h).array;
      pcVar9 = strchr((char *)__s,0x6b);
      bVar22 = pcVar9 != (char *)0x0;
      pcVar10 = strchr((char *)__s,0x76);
      if (pcVar9 == (char *)0x0 && pcVar10 == (char *)0x0) goto LAB_00107f36;
      (L->gch).marked =
           (pcVar10 != (char *)0x0) << 4 | (pcVar9 != (char *)0x0) * '\b' | (L->gch).marked & 0xe7;
      (L->h).gclist = g->weak;
      g->weak = L;
      if (pcVar9 == (char *)0x0 || pcVar10 == (char *)0x0) {
        bVar20 = true;
        if (pcVar10 == (char *)0x0) goto LAB_00107f3e;
        goto LAB_00107f7a;
      }
LAB_0010800e:
      (L->gch).marked = (L->gch).marked & 0xfb;
    }
    uVar12 = (long)(L->h).sizearray * 0x10 + (0x28L << ((L->h).lsizenode & 0x3f)) + 0x40;
    break;
  case '\x06':
    g->gray = (GCObject *)(L->h).metatable;
    if (((((GCObject *)(L->h).array)->gch).marked & 3) != 0) {
      reallymarkobject(g,(GCObject *)(L->h).array);
    }
    if ((L->h).flags == '\0') {
      if (((((GCObject *)(L->h).node)->gch).marked & 3) != 0) {
        reallymarkobject(g,(GCObject *)(L->h).node);
      }
      for (uVar12 = 0; bVar3 = (L->h).lsizenode, uVar12 < bVar3; uVar12 = uVar12 + 1) {
        pGVar14 = *(GCObject **)((long)L + uVar12 * 8 + 0x28);
        if (((pGVar14->gch).marked & 3) != 0) {
          reallymarkobject(g,pGVar14);
        }
      }
    }
    else {
      ppGVar18 = &(L->h).gclist;
      for (uVar12 = 0; bVar3 = (L->h).lsizenode, uVar12 < bVar3; uVar12 = uVar12 + 1) {
        if ((3 < *(int *)ppGVar18) && (((ppGVar18[-1]->gch).marked & 3) != 0)) {
          reallymarkobject(g,ppGVar18[-1]);
        }
        ppGVar18 = ppGVar18 + 2;
      }
    }
    uVar12 = (ulong)(((uint)bVar3 << (4U - ((L->h).flags == '\0') & 0x1f)) + 0x28 & 0xfff8);
    break;
  case '\b':
    g->gray = (L->th).gclist;
    (L->th).gclist = g->grayagain;
    g->grayagain = L;
    (L->gch).marked = (L->gch).marked & 0xfb;
    if ((3 < (L->th).l_gt.tt) && (pGVar14 = (L->th).l_gt.value.gc, ((pGVar14->gch).marked & 3) != 0)
       ) {
      reallymarkobject(g,pGVar14);
    }
    pTVar11 = (L->h).metatable;
    pTVar17 = pTVar11;
    for (pCVar13 = (L->th).base_ci; pCVar13 <= (CallInfo *)(L->h).lastfree; pCVar13 = pCVar13 + 1) {
      if (pTVar17 < (Table *)pCVar13->top) {
        pTVar17 = (Table *)pCVar13->top;
      }
    }
    for (pTVar15 = (Table *)(L->th).stack; pTVar15 < pTVar11; pTVar15 = (Table *)&pTVar15->metatable
        ) {
      if ((3 < *(int *)&pTVar15->tt) && (((((Value *)&pTVar15->next)->gc->gch).marked & 3) != 0)) {
        reallymarkobject(g,((Value *)&pTVar15->next)->gc);
        pTVar11 = (L->h).metatable;
      }
    }
    for (; pTVar15 <= pTVar17; pTVar15 = (Table *)&pTVar15->metatable) {
      *(int *)&pTVar15->tt = 0;
    }
    uVar4 = (L->p).sizelocvars;
    if ((int)uVar4 < 0x4e21) {
      pTVar5 = (L->p).source;
      if ((0x10 < (int)uVar4) &&
         ((int)(((long)(L->h).lastfree - (long)(L->th).base_ci) / 0x28) * 4 < (int)uVar4)) {
        luaD_reallocCI(&L->th,uVar4 >> 1);
      }
      uVar4 = (L->p).sizep;
      if (0x5a < (int)uVar4 &&
          (int)((uint)((ulong)((long)pTVar17 - (long)pTVar5) >> 2) & 0xfffffffc) < (int)uVar4) {
        luaD_reallocstack(&L->th,uVar4 >> 1);
      }
    }
    uVar12 = (long)(L->p).sizep * 0x10 + (long)(L->p).sizelocvars * 0x28 + 0xb8;
    break;
  case '\t':
    g->gray = (L->p).gclist;
    if ((L->th).stack != (StkId)0x0) {
      pbVar2 = (byte *)((long)&((L->th).stack)->tt + 1);
      *pbVar2 = *pbVar2 & 0xfc;
    }
    lVar19 = 8;
    for (lVar16 = 0; lVar16 < (L->p).sizek; lVar16 = lVar16 + 1) {
      if ((3 < *(int *)((long)&((L->h).metatable)->next + lVar19)) &&
         (pGVar14 = *(GCObject **)((long)(L->h).metatable + lVar19 + -8),
         ((pGVar14->gch).marked & 3) != 0)) {
        reallymarkobject(g,pGVar14);
      }
      lVar19 = lVar19 + 0x10;
    }
    for (lVar19 = 0; lVar19 < (L->p).sizeupvalues; lVar19 = lVar19 + 1) {
      pGVar14 = (&((StkId)(L->p).upvalues)->value)[lVar19].gc;
      if (pGVar14 != (GCObject *)0x0) {
        plVar1 = &(pGVar14->gch).marked;
        *plVar1 = *plVar1 & 0xfc;
      }
    }
    for (lVar19 = 0; lVar19 < (L->p).sizep; lVar19 = lVar19 + 1) {
      pGVar14 = (GCObject *)(&(((global_State *)(L->h).node)->strt).hash)[lVar19];
      if ((pGVar14 != (GCObject *)0x0) && (((pGVar14->gch).marked & 3) != 0)) {
        reallymarkobject(g,pGVar14);
      }
    }
    lVar19 = 0;
    for (lVar16 = 0; lVar16 < (L->p).sizelocvars; lVar16 = lVar16 + 1) {
      lVar6 = *(long *)((long)(L->h).gclist + lVar19);
      if (lVar6 != 0) {
        pbVar2 = (byte *)(lVar6 + 9);
        *pbVar2 = *pbVar2 & 0xfc;
      }
      lVar19 = lVar19 + 0x10;
    }
    uVar12 = ((long)(L->p).sizek + (long)(L->p).sizelocvars) * 0x10 +
             ((long)(L->p).sizelineinfo + (long)(L->p).sizecode) * 4 +
             ((long)(L->p).sizeupvalues + (long)(L->p).sizep) * 8 + 0x78;
  }
  return uVar12;
}

Assistant:

static l_mem propagatemark(global_State*g){
GCObject*o=g->gray;
gray2black(o);
switch(o->gch.tt){
case 5:{
Table*h=gco2h(o);
g->gray=h->gclist;
if(traversetable(g,h))
black2gray(o);
return sizeof(Table)+sizeof(TValue)*h->sizearray+
sizeof(Node)*sizenode(h);
}
case 6:{
Closure*cl=gco2cl(o);
g->gray=cl->c.gclist;
traverseclosure(g,cl);
return(cl->c.isC)?sizeCclosure(cl->c.nupvalues):
sizeLclosure(cl->l.nupvalues);
}
case 8:{
lua_State*th=gco2th(o);
g->gray=th->gclist;
th->gclist=g->grayagain;
g->grayagain=o;
black2gray(o);
traversestack(g,th);
return sizeof(lua_State)+sizeof(TValue)*th->stacksize+
sizeof(CallInfo)*th->size_ci;
}
case(8+1):{
Proto*p=gco2p(o);
g->gray=p->gclist;
traverseproto(g,p);
return sizeof(Proto)+sizeof(Instruction)*p->sizecode+
sizeof(Proto*)*p->sizep+
sizeof(TValue)*p->sizek+
sizeof(int)*p->sizelineinfo+
sizeof(LocVar)*p->sizelocvars+
sizeof(TString*)*p->sizeupvalues;
}
default:return 0;
}
}